

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

void __thiscall cmCTestGIT::CommitParser::DoBodyLine(CommitParser *this)

{
  long *local_30 [2];
  long local_20 [2];
  
  if (3 < (this->super_DiffParser).super_LineParser.Line._M_string_length) {
    std::__cxx11::string::substr
              ((ulong)local_30,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::_M_append((char *)&(this->Rev).Log,(ulong)local_30[0]);
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
  }
  std::__cxx11::string::append((char *)&(this->Rev).Log);
  return;
}

Assistant:

void DoBodyLine()
  {
    // Commit log lines are indented by 4 spaces.
    if (this->Line.size() >= 4) {
      this->Rev.Log += this->Line.substr(4);
    }
    this->Rev.Log += "\n";
  }